

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QString * __thiscall QGraphicsItem::toolTip(QString *__return_storage_ptr__,QGraphicsItem *this)

{
  long in_FS_OFFSET;
  QVariant QStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QGraphicsItemPrivate::extra(&QStack_38,(this->d_ptr).d,ExtraToolTip);
  ::QVariant::toString();
  ::QVariant::~QVariant(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QGraphicsItem::toolTip() const
{
    return d_ptr->extra(QGraphicsItemPrivate::ExtraToolTip).toString();
}